

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void __thiscall
Am_Standard_Opal_Handlers::Configure_Notify
          (Am_Standard_Opal_Handlers *this,Am_Drawonable *draw,int left,int top,int width,int height
          )

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  int w_height;
  int w_width;
  int w_top;
  int w_left;
  Am_Object window;
  Am_Wrapper *window_data;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Drawonable *draw_local;
  Am_Standard_Opal_Handlers *this_local;
  
  window.data = (Am_Object_Data *)Am_Drawonable::Get_Data_Store(draw);
  Am_Wrapper::Note_Reference((Am_Wrapper *)window.data);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc8,window.data);
  pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,0x66,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,0x67,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if (iVar1 != left) {
    Am_Object::Set((Am_Object *)&stack0xffffffffffffffc8,100,left,0);
  }
  if (iVar2 != top) {
    Am_Object::Set((Am_Object *)&stack0xffffffffffffffc8,0x65,top,0);
  }
  if (iVar3 != width) {
    Am_Object::Set((Am_Object *)&stack0xffffffffffffffc8,0x66,width,0);
  }
  if (iVar4 != height) {
    Am_Object::Set((Am_Object *)&stack0xffffffffffffffc8,0x67,height,0);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void Configure_Notify(Am_Drawonable *draw, int left, int top, int width,
                        int height) override
  {
    Am_Wrapper *window_data = (Am_Wrapper *)draw->Get_Data_Store();
    window_data->Note_Reference();
    Am_Object window((Am_Object_Data *)window_data);
    ASSERT_WINDOW
    //// DEBUG
    // std::cout << "configure event window=" << window << " left=" << left << " top="
    //     << top << " width=" << width << " height=" << height <<std::endl;
    int w_left = window.Get(Am_LEFT);
    int w_top = window.Get(Am_TOP);
    int w_width = window.Get(Am_WIDTH);
    int w_height = window.Get(Am_HEIGHT);
    if (w_left != left)
      window.Set(Am_LEFT, left);
    if (w_top != top)
      window.Set(Am_TOP, top);
    if (w_width != width)
      window.Set(Am_WIDTH, width);
    if (w_height != height)
      window.Set(Am_HEIGHT, height);
  }